

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cameras.cpp
# Opt level: O1

optional<pbrt::CameraRay> * __thiscall
pbrt::OrthographicCamera::GenerateRay
          (optional<pbrt::CameraRay> *__return_storage_ptr__,OrthographicCamera *this,
          CameraSample sample,SampledWavelengths *lambda)

{
  bool bVar1;
  float fVar2;
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  float fVar7;
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  float fVar11;
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  Ray local_b0;
  undefined1 local_88 [16];
  undefined1 local_78 [16];
  undefined1 local_68 [16];
  anon_struct_8_0_00000001_for___align local_50;
  float fStack_48;
  float fStack_44;
  float fStack_40;
  undefined8 uStack_3c;
  TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  local_30;
  
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y *
                                         (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][1]))
                           ,ZEXT416((uint)sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x),
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][0]))
  ;
  auVar4 = ZEXT816(0) << 0x40;
  auVar3 = vfmadd231ss_fma(auVar3,auVar4,
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[0][2]))
  ;
  fVar6 = auVar3._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[0][3];
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y *
                                         (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][1]))
                           ,ZEXT416((uint)sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x),
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][0]))
  ;
  auVar3 = vfmadd231ss_fma(auVar3,auVar4,
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[1][2]))
  ;
  fVar7 = auVar3._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[1][3];
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y *
                                         (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][1]))
                           ,ZEXT416((uint)sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x),
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[2][0]))
  ;
  auVar3 = vfmadd231ss_fma(auVar3,auVar4,
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[2][2]))
  ;
  fVar11 = auVar3._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[2][3];
  auVar3 = vfmadd231ss_fma(ZEXT416((uint)(sample.pFilm.super_Tuple2<pbrt::Point2,_float>.y *
                                         (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][1]))
                           ,ZEXT416((uint)sample.pFilm.super_Tuple2<pbrt::Point2,_float>.x),
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][0]))
  ;
  auVar3 = vfmadd231ss_fma(auVar3,auVar4,
                           ZEXT416((uint)(this->super_ProjectiveCamera).cameraFromRaster.m.m[3][2]))
  ;
  fVar2 = auVar3._0_4_ + (this->super_ProjectiveCamera).cameraFromRaster.m.m[3][3];
  bVar1 = fVar2 == 1.0;
  auVar3 = vinsertps_avx(ZEXT416((uint)bVar1 * (int)fVar6 + (uint)!bVar1 * (int)(fVar6 / fVar2)),
                         ZEXT416((uint)bVar1 * (int)fVar7 + (uint)!bVar1 * (int)(fVar7 / fVar2)),
                         0x10);
  local_b0.o.super_Tuple3<pbrt::Point3,_float>.z =
       (float)((uint)bVar1 * (int)fVar11 + (uint)!bVar1 * (int)(fVar11 / fVar2));
  auVar4 = vfmadd231ss_fma(ZEXT416((uint)(sample.time *
                                         (this->super_ProjectiveCamera).super_CameraBase.
                                         shutterClose)),ZEXT416((uint)(1.0 - sample.time)),
                           ZEXT416((uint)(this->super_ProjectiveCamera).super_CameraBase.shutterOpen
                                  ));
  local_b0.medium.
  super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
  .bits = (TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
           )(this->super_ProjectiveCamera).super_CameraBase.medium.
            super_TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
            .bits;
  local_b0.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar3);
  local_b0.d.super_Tuple3<pbrt::Vector3,_float>.x = 0.0;
  local_b0.d.super_Tuple3<pbrt::Vector3,_float>.y = 0.0;
  local_b0.d.super_Tuple3<pbrt::Vector3,_float>.z = 1.0;
  local_b0.time = auVar4._0_4_;
  fVar6 = (this->super_ProjectiveCamera).lensRadius;
  if (fVar6 <= 0.0) goto LAB_003558fc;
  auVar4._0_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.x +
                 sample.pLens.super_Tuple2<pbrt::Point2,_float>.x;
  auVar4._4_4_ = sample.pLens.super_Tuple2<pbrt::Point2,_float>.y +
                 sample.pLens.super_Tuple2<pbrt::Point2,_float>.y;
  auVar4._8_8_ = 0;
  auVar3._8_4_ = 0xbf800000;
  auVar3._0_8_ = 0xbf800000bf800000;
  auVar3._12_4_ = 0xbf800000;
  auVar4 = vaddps_avx512vl(auVar4,auVar3);
  auVar3 = vmovshdup_avx(auVar4);
  fVar7 = auVar4._0_4_;
  fVar11 = auVar3._0_4_;
  if ((fVar7 != 0.0) || (NAN(fVar7))) {
LAB_003557c8:
    auVar8._8_4_ = 0x7fffffff;
    auVar8._0_8_ = 0x7fffffff7fffffff;
    auVar8._12_4_ = 0x7fffffff;
    auVar5 = vandps_avx512vl(auVar4,auVar8);
    auVar8 = vshufps_avx(auVar5,auVar5,0xf5);
    bVar1 = auVar8._0_4_ < auVar5._0_4_;
    auVar5._0_4_ = fVar7 / fVar11;
    auVar5._4_12_ = auVar4._4_12_;
    auVar4 = vfmadd213ss_fma(SUB6416(ZEXT464(0xbf490fdb),0),auVar5,ZEXT416(0x3fc90fdb));
    local_68._4_12_ = auVar4._4_12_;
    local_68._0_4_ = (uint)bVar1 * (int)((fVar11 / fVar7) * 0.7853982) + (uint)!bVar1 * auVar4._0_4_
    ;
    local_88._4_12_ = auVar3._4_12_;
    local_88._0_4_ = (uint)bVar1 * (int)fVar7 + (uint)!bVar1 * (int)fVar11;
    local_78 = ZEXT416((uint)fVar6);
    fVar6 = cosf((float)local_68._0_4_);
    fVar7 = sinf((float)local_68._0_4_);
    auVar8 = vinsertps_avx(ZEXT416((uint)((float)local_88._0_4_ * fVar6)),
                           ZEXT416((uint)((float)local_88._0_4_ * fVar7)),0x10);
    fVar6 = (float)local_78._0_4_;
  }
  else {
    auVar8 = ZEXT416(0) << 0x40;
    if ((fVar11 != 0.0) || (NAN(fVar11))) goto LAB_003557c8;
  }
  fVar11 = (this->super_ProjectiveCamera).focalDistance /
           local_b0.d.super_Tuple3<pbrt::Vector3,_float>.z;
  fVar7 = local_b0.d.super_Tuple3<pbrt::Vector3,_float>.z * fVar11 +
          local_b0.o.super_Tuple3<pbrt::Point3,_float>.z;
  auVar9._0_4_ = fVar6 * auVar8._0_4_;
  auVar9._4_4_ = fVar6 * auVar8._4_4_;
  auVar9._8_4_ = fVar6 * auVar8._8_4_;
  auVar9._12_4_ = fVar6 * auVar8._12_4_;
  local_b0.o.super_Tuple3<pbrt::Point3,_float>.z = 0.0;
  auVar12._0_4_ =
       local_b0.d.super_Tuple3<pbrt::Vector3,_float>.x * fVar11 +
       local_b0.o.super_Tuple3<pbrt::Point3,_float>.x;
  auVar12._4_4_ =
       local_b0.d.super_Tuple3<pbrt::Vector3,_float>.y * fVar11 +
       local_b0.o.super_Tuple3<pbrt::Point3,_float>.y;
  auVar12._8_4_ = fVar11 * 0.0 + 0.0;
  auVar12._12_4_ = fVar11 * 0.0 + 0.0;
  local_b0.o.super_Tuple3<pbrt::Point3,_float>._0_8_ = vmovlps_avx(auVar9);
  auVar4 = vsubps_avx(auVar12,auVar9);
  auVar10._0_4_ = auVar4._0_4_ * auVar4._0_4_;
  auVar10._4_4_ = auVar4._4_4_ * auVar4._4_4_;
  auVar10._8_4_ = auVar4._8_4_ * auVar4._8_4_;
  auVar10._12_4_ = auVar4._12_4_ * auVar4._12_4_;
  auVar3 = vmovshdup_avx(auVar10);
  auVar3 = vfmadd231ss_fma(auVar3,auVar4,auVar4);
  auVar3 = vfmadd231ss_fma(auVar3,ZEXT416((uint)fVar7),ZEXT416((uint)fVar7));
  if (auVar3._0_4_ < 0.0) {
    local_78._0_4_ = fVar7;
    local_88 = auVar4;
    local_b0.d.super_Tuple3<pbrt::Vector3,_float>.z = sqrtf(auVar3._0_4_);
    fVar7 = (float)local_78._0_4_;
    auVar4 = local_88;
  }
  else {
    auVar3 = vsqrtss_avx(auVar3,auVar3);
    local_b0.d.super_Tuple3<pbrt::Vector3,_float>.z = auVar3._0_4_;
  }
  auVar13._4_4_ = local_b0.d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._0_4_ = local_b0.d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._8_4_ = local_b0.d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar13._12_4_ = local_b0.d.super_Tuple3<pbrt::Vector3,_float>.z;
  auVar3 = vdivps_avx(auVar4,auVar13);
  local_b0.d.super_Tuple3<pbrt::Vector3,_float>.z =
       fVar7 / local_b0.d.super_Tuple3<pbrt::Vector3,_float>.z;
  local_b0.d.super_Tuple3<pbrt::Vector3,_float>._0_8_ = vmovlps_avx(auVar3);
LAB_003558fc:
  AnimatedTransform::operator()((Ray *)&local_50,(AnimatedTransform *)this,&local_b0,(Float *)0x0);
  __return_storage_ptr__->set = true;
  (__return_storage_ptr__->optionalValue).__align = local_50;
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 8) = CONCAT44(fStack_44,fStack_48);
  *(ulong *)((long)&__return_storage_ptr__->optionalValue + 0xc) = CONCAT44(fStack_40,fStack_44);
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x14) = uStack_3c;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x20) = 0;
  ((TaggedPointer<pbrt::HomogeneousMedium,_pbrt::GeneralMedium<pbrt::UniformGridMediumProvider>,_pbrt::GeneralMedium<pbrt::CloudMediumProvider>,_pbrt::GeneralMedium<pbrt::NanoVDBMediumProvider>_>
    *)((long)&__return_storage_ptr__->optionalValue + 0x20))->bits = local_30.bits;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x28) = 0x3f8000003f800000;
  *(undefined8 *)((long)&__return_storage_ptr__->optionalValue + 0x30) = 0x3f8000003f800000;
  return __return_storage_ptr__;
}

Assistant:

pstd::optional<CameraRay> OrthographicCamera::GenerateRay(
    CameraSample sample, SampledWavelengths &lambda) const {
    // Compute raster and camera sample positions
    Point3f pFilm = Point3f(sample.pFilm.x, sample.pFilm.y, 0);
    Point3f pCamera = cameraFromRaster(pFilm);

    Ray ray(pCamera, Vector3f(0, 0, 1), SampleTime(sample.time), medium);
    // Modify ray for depth of field
    if (lensRadius > 0) {
        // Sample point on lens
        Point2f pLens = lensRadius * SampleUniformDiskConcentric(sample.pLens);

        // Compute point on plane of focus
        Float ft = focalDistance / ray.d.z;
        Point3f pFocus = ray(ft);

        // Update ray for effect of lens
        ray.o = Point3f(pLens.x, pLens.y, 0);
        ray.d = Normalize(pFocus - ray.o);
    }

    return CameraRay{RenderFromCamera(ray)};
}